

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O0

void tt_face_done_kern(TT_Face face)

{
  FT_Stream stream;
  TT_Face face_local;
  
  FT_Stream_ReleaseFrame((face->root).stream,&face->kern_table);
  face->kern_table_size = 0;
  face->num_kern_tables = 0;
  face->kern_avail_bits = 0;
  face->kern_order_bits = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_done_kern( TT_Face  face )
  {
    FT_Stream  stream = face->root.stream;


    FT_FRAME_RELEASE( face->kern_table );
    face->kern_table_size = 0;
    face->num_kern_tables = 0;
    face->kern_avail_bits = 0;
    face->kern_order_bits = 0;
  }